

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::LE_Fire_PDU::SetWarheadFuseFlag(LE_Fire_PDU *this,KBOOL F)

{
  if ((((this->m_FireFlagUnion).m_ui8Flag & 0x10) == 0) == F) {
    (this->m_FireFlagUnion).m_ui8Flag = (this->m_FireFlagUnion).m_ui8Flag & 0xef | F << 4;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 8 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 4;
  }
  return;
}

Assistant:

void LE_Fire_PDU::SetWarheadFuseFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_FireFlagUnion.m_ui8WarheadFuse )return;

    m_FireFlagUnion.m_ui8WarheadFuse = F;

    if( F )
    {
        m_ui16PDULength += 4; // 4 = size of warhead and fuse fields in the Munition Descriptor.
    }
    else
    {
        m_ui16PDULength -= 4;
    }
}